

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_iterator_previous(void **param_1)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  _Bool _Var4;
  roaring64_bitmap_t *r;
  roaring64_iterator_t *it;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  roaring64_bulk_context_t context;
  
  r = roaring64_bitmap_create();
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&values,1000);
  context.high_bytes[0] = '\0';
  context.high_bytes[1] = '\0';
  context.high_bytes[2] = '\0';
  context.high_bytes[3] = '\0';
  context.high_bytes[4] = '\0';
  context.high_bytes[5] = '\0';
  context._6_2_ = 0;
  context.leaf = (roaring64_leaf_t *)0x0;
  for (uVar5 = 0;
      puVar2 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
      puVar1 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, uVar5 != 10000000; uVar5 = uVar5 + 10000) {
    v = uVar5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&values,&v);
    roaring64_bitmap_add_bulk(r,(roaring64_bulk_context_t *)&context,v);
  }
  it = roaring64_iterator_create_last(r);
  uVar7 = ((long)puVar2 - (long)puVar1) * 0x20000000 - 0x100000000;
  uVar8 = uVar7 & 0xffffffff00000000;
  lVar3 = ((long)uVar7 >> 0x20) << 3;
  do {
    lVar6 = lVar3;
    uVar5 = roaring64_iterator_value(it);
    _assert_int_equal(uVar5,*(unsigned_long *)
                             ((long)values.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar6),
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x70f);
    _Var4 = roaring64_iterator_previous(it);
    uVar8 = uVar8 - 0x100000000;
    lVar3 = lVar6 + -8;
  } while (_Var4);
  _assert_int_equal((long)uVar8 >> 0x20,0xffffffffffffffff,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x712);
  _Var4 = roaring64_iterator_advance(it);
  _assert_true((ulong)_Var4,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x715);
  uVar5 = roaring64_iterator_value(it);
  _assert_int_equal(uVar5,*(unsigned_long *)
                           ((long)values.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar6),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x717);
  _Var4 = roaring64_iterator_previous(it);
  _assert_true((ulong)!_Var4,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x71a);
  roaring64_iterator_free(it);
  roaring64_bitmap_free(r);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_previous) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }
    int i = ((int)values.size()) - 1;
    roaring64_iterator_t* it = roaring64_iterator_create_last(r);
    do {
        assert_int_equal(roaring64_iterator_value(it), values[i]);
        i--;
    } while (roaring64_iterator_previous(it));
    assert_int_equal(i, -1);

    // Check that we can move forward from before the first entry.
    assert_true(roaring64_iterator_advance(it));
    i++;
    assert_int_equal(roaring64_iterator_value(it), values[i]);

    // Check that we can't move backward again.
    assert_false(roaring64_iterator_previous(it));

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}